

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase581::run(TestCase581 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  Builder *params;
  Builder *extraout_RDX;
  Builder *params_00;
  Builder *extraout_RDX_00;
  Builder local_440;
  String local_418;
  bool local_3f9;
  undefined1 local_3f8 [7];
  bool _kj_shouldLog_4;
  String local_3d0;
  Builder local_3b8;
  String local_390;
  bool local_371;
  undefined1 local_370 [7];
  bool _kj_shouldLog_3;
  String local_348;
  Builder local_330;
  String local_308;
  bool local_2e9;
  undefined1 local_2e8 [7];
  bool _kj_shouldLog_2;
  String local_2c0;
  Builder local_2a8;
  String local_280;
  bool local_261;
  undefined1 local_260 [7];
  bool _kj_shouldLog_1;
  String local_238;
  String local_220;
  bool local_201;
  undefined1 local_200 [7];
  bool _kj_shouldLog;
  Builder local_1e8;
  Builder local_1c0;
  ArrayPtr<const_char> local_198;
  Builder local_188;
  Builder local_160;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase581 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestUnion>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestUnion::Builder::getUnion0(&local_160,(Builder *)local_128);
  capnproto_test::capnp::test::TestUnion::Union0::Builder::setU0f0s16(&local_160,0x7b);
  capnproto_test::capnp::test::TestUnion::Builder::getUnion1(&local_188,(Builder *)local_128);
  Text::Reader::Reader((Reader *)&local_198,"foo");
  capnproto_test::capnp::test::TestUnion::Union1::Builder::setU1f0sp(&local_188,(Reader)local_198);
  capnproto_test::capnp::test::TestUnion::Builder::getUnion2(&local_1c0,(Builder *)local_128);
  capnproto_test::capnp::test::TestUnion::Union2::Builder::setU2f0s1(&local_1c0,true);
  capnproto_test::capnp::test::TestUnion::Builder::getUnion3(&local_1e8,(Builder *)local_128);
  capnproto_test::capnp::test::TestUnion::Union3::Builder::setU3f0s64(&local_1e8,0x1b69b4ba630f34e);
  kj::str<capnproto_test::capnp::test::TestUnion::Builder&>
            ((String *)local_200,(kj *)local_128,params);
  bVar1 = kj::operator==("(union0 = (u0f0s16 = 123), union1 = (u1f0sp = \"foo\"), union2 = (u2f0s1 = true), union3 = (u3f0s64 = 123456789012345678), bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, bit6 = false, bit7 = false, byte0 = 0)"
                         ,(String *)local_200);
  kj::String::~String((String *)local_200);
  if (!bVar1) {
    local_201 = kj::_::Debug::shouldLog(ERROR);
    params_00 = extraout_RDX;
    while (local_201 != false) {
      kj::str<capnproto_test::capnp::test::TestUnion::Builder&>
                (&local_220,(kj *)local_128,params_00);
      kj::_::Debug::log<char_const(&)[290],char_const(&)[230],kj::String>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x255,ERROR,
                 "\"failed: expected \" \"(\\\"(\\\" \\\"union0 = (u0f0s16 = 123), \\\" \\\"union1 = (u1f0sp = \\\\\\\"foo\\\\\\\"), \\\" \\\"union2 = (u2f0s1 = true), \\\" \\\"union3 = (u3f0s64 = 123456789012345678), \\\" \\\"bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, \\\" \\\"bit6 = false, bit7 = false, byte0 = 0)\\\") == (kj::str(root))\", \"(\" \"union0 = (u0f0s16 = 123), \" \"union1 = (u1f0sp = \\\"foo\\\"), \" \"union2 = (u2f0s1 = true), \" \"union3 = (u3f0s64 = 123456789012345678), \" \"bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, \" \"bit6 = false, bit7 = false, byte0 = 0)\", kj::str(root)"
                 ,(char (*) [290])
                  "failed: expected (\"(\" \"union0 = (u0f0s16 = 123), \" \"union1 = (u1f0sp = \\\"foo\\\"), \" \"union2 = (u2f0s1 = true), \" \"union3 = (u3f0s64 = 123456789012345678), \" \"bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, \" \"bit6 = false, bit7 = false, byte0 = 0)\") == (kj::str(root))"
                 ,(char (*) [230])
                  "(union0 = (u0f0s16 = 123), union1 = (u1f0sp = \"foo\"), union2 = (u2f0s1 = true), union3 = (u3f0s64 = 123456789012345678), bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, bit6 = false, bit7 = false, byte0 = 0)"
                 ,&local_220);
      kj::String::~String(&local_220);
      params_00 = extraout_RDX_00;
      local_201 = false;
    }
  }
  capnproto_test::capnp::test::TestUnion::Builder::getUnion0
            ((Builder *)local_260,(Builder *)local_128);
  kj::str<capnproto_test::capnp::test::TestUnion::Union0::Builder>(&local_238,(Builder *)local_260);
  bVar1 = kj::operator==("(u0f0s16 = 123)",&local_238);
  kj::String::~String(&local_238);
  if (!bVar1) {
    local_261 = kj::_::Debug::shouldLog(ERROR);
    while (local_261 != false) {
      capnproto_test::capnp::test::TestUnion::Builder::getUnion0(&local_2a8,(Builder *)local_128);
      kj::str<capnproto_test::capnp::test::TestUnion::Union0::Builder>(&local_280,&local_2a8);
      kj::_::Debug::log<char_const(&)[68],char_const(&)[16],kj::String>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,599,ERROR,
                 "\"failed: expected \" \"(\\\"(u0f0s16 = 123)\\\") == (kj::str(root.getUnion0()))\", \"(u0f0s16 = 123)\", kj::str(root.getUnion0())"
                 ,(char (*) [68])
                  "failed: expected (\"(u0f0s16 = 123)\") == (kj::str(root.getUnion0()))",
                 (char (*) [16])"(u0f0s16 = 123)",&local_280);
      kj::String::~String(&local_280);
      local_261 = false;
    }
  }
  capnproto_test::capnp::test::TestUnion::Builder::getUnion1
            ((Builder *)local_2e8,(Builder *)local_128);
  kj::str<capnproto_test::capnp::test::TestUnion::Union1::Builder>(&local_2c0,(Builder *)local_2e8);
  bVar1 = kj::operator==("(u1f0sp = \"foo\")",&local_2c0);
  kj::String::~String(&local_2c0);
  if (!bVar1) {
    local_2e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_2e9 != false) {
      capnproto_test::capnp::test::TestUnion::Builder::getUnion1(&local_330,(Builder *)local_128);
      kj::str<capnproto_test::capnp::test::TestUnion::Union1::Builder>(&local_308,&local_330);
      kj::_::Debug::log<char_const(&)[71],char_const(&)[17],kj::String>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,600,ERROR,
                 "\"failed: expected \" \"(\\\"(u1f0sp = \\\\\\\"foo\\\\\\\")\\\") == (kj::str(root.getUnion1()))\", \"(u1f0sp = \\\"foo\\\")\", kj::str(root.getUnion1())"
                 ,(char (*) [71])
                  "failed: expected (\"(u1f0sp = \\\"foo\\\")\") == (kj::str(root.getUnion1()))",
                 (char (*) [17])"(u1f0sp = \"foo\")",&local_308);
      kj::String::~String(&local_308);
      local_2e9 = false;
    }
  }
  capnproto_test::capnp::test::TestUnion::Builder::getUnion2
            ((Builder *)local_370,(Builder *)local_128);
  kj::str<capnproto_test::capnp::test::TestUnion::Union2::Builder>(&local_348,(Builder *)local_370);
  bVar1 = kj::operator==("(u2f0s1 = true)",&local_348);
  kj::String::~String(&local_348);
  if (!bVar1) {
    local_371 = kj::_::Debug::shouldLog(ERROR);
    while (local_371 != false) {
      capnproto_test::capnp::test::TestUnion::Builder::getUnion2(&local_3b8,(Builder *)local_128);
      kj::str<capnproto_test::capnp::test::TestUnion::Union2::Builder>(&local_390,&local_3b8);
      kj::_::Debug::log<char_const(&)[68],char_const(&)[16],kj::String>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x259,ERROR,
                 "\"failed: expected \" \"(\\\"(u2f0s1 = true)\\\") == (kj::str(root.getUnion2()))\", \"(u2f0s1 = true)\", kj::str(root.getUnion2())"
                 ,(char (*) [68])
                  "failed: expected (\"(u2f0s1 = true)\") == (kj::str(root.getUnion2()))",
                 (char (*) [16])"(u2f0s1 = true)",&local_390);
      kj::String::~String(&local_390);
      local_371 = false;
    }
  }
  capnproto_test::capnp::test::TestUnion::Builder::getUnion3
            ((Builder *)local_3f8,(Builder *)local_128);
  kj::str<capnproto_test::capnp::test::TestUnion::Union3::Builder>(&local_3d0,(Builder *)local_3f8);
  bVar1 = kj::operator==("(u3f0s64 = 123456789012345678)",&local_3d0);
  kj::String::~String(&local_3d0);
  if (!bVar1) {
    local_3f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_3f9 != false) {
      capnproto_test::capnp::test::TestUnion::Builder::getUnion3(&local_440,(Builder *)local_128);
      kj::str<capnproto_test::capnp::test::TestUnion::Union3::Builder>(&local_418,&local_440);
      kj::_::Debug::log<char_const(&)[83],char_const(&)[31],kj::String>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/stringify-test.c++"
                 ,0x25a,ERROR,
                 "\"failed: expected \" \"(\\\"(u3f0s64 = 123456789012345678)\\\") == (kj::str(root.getUnion3()))\", \"(u3f0s64 = 123456789012345678)\", kj::str(root.getUnion3())"
                 ,(char (*) [83])
                  "failed: expected (\"(u3f0s64 = 123456789012345678)\") == (kj::str(root.getUnion3()))"
                 ,(char (*) [31])"(u3f0s64 = 123456789012345678)",&local_418);
      kj::String::~String(&local_418);
      local_3f9 = false;
    }
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Stringify, Unions) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestUnion>();

  root.getUnion0().setU0f0s16(123);
  root.getUnion1().setU1f0sp("foo");
  root.getUnion2().setU2f0s1(true);
  root.getUnion3().setU3f0s64(123456789012345678ll);

  EXPECT_EQ("("
      "union0 = (u0f0s16 = 123), "
      "union1 = (u1f0sp = \"foo\"), "
      "union2 = (u2f0s1 = true), "
      "union3 = (u3f0s64 = 123456789012345678), "
      "bit0 = false, bit2 = false, bit3 = false, bit4 = false, bit5 = false, "
      "bit6 = false, bit7 = false, byte0 = 0)",
      kj::str(root));

  EXPECT_EQ("(u0f0s16 = 123)", kj::str(root.getUnion0()));
  EXPECT_EQ("(u1f0sp = \"foo\")", kj::str(root.getUnion1()));
  EXPECT_EQ("(u2f0s1 = true)", kj::str(root.getUnion2()));
  EXPECT_EQ("(u3f0s64 = 123456789012345678)", kj::str(root.getUnion3()));
}